

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

size_t xmi_process_INFO(PBuffer *buffer,MidiFile *param_2)

{
  element_type *peVar1;
  size_t sVar2;
  Stream *pSVar3;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [18];
  uint16_t track_count;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [16];
  MidiFile *param_1_local;
  PBuffer *buffer_local;
  
  local_20._8_8_ = param_2;
  param_1_local = (MidiFile *)buffer;
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  sVar2 = Buffer::get_size(peVar1);
  if (sVar2 == 2) {
    peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        buffer);
    local_60._10_2_ = Buffer::pop<unsigned_short>(peVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"xmi2mid",&local_81);
    Log::Logger::operator[]((Logger *)local_60,(string *)&Log::Verbose);
    pSVar3 = Log::Stream::operator<<((Stream *)local_60,"\tXMI contains ");
    pSVar3 = Log::Stream::operator<<(pSVar3,(unsigned_short *)(local_60 + 10));
    Log::Stream::operator<<(pSVar3," track(s)");
    Log::Stream::~Stream((Stream *)local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"xmi2mid",&local_41);
    Log::Logger::operator[]((Logger *)local_20,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)local_20,"\tInconsistent INFO block.");
    Log::Stream::~Stream((Stream *)local_20);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  sVar2 = Buffer::get_size(peVar1);
  return sVar2;
}

Assistant:

static size_t
xmi_process_INFO(PBuffer buffer, MidiFile * /*midi*/) {
  if (buffer->get_size() != 2) {
    Log::Debug["xmi2mid"] << "\tInconsistent INFO block.";
  } else {
    uint16_t track_count = buffer->pop<uint16_t>();
    Log::Verbose["xmi2mid"] << "\tXMI contains " << track_count << " track(s)";
  }
  return buffer->get_size();
}